

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

bool __thiscall position::in_dangerous_check(position *this)

{
  Piece PVar1;
  Square SVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  Color local_c;
  Color local_8;
  Square local_4;
  
  if (((this->ifo).incheck == true) && (uVar3 = (this->ifo).checkers, uVar3 != 0)) {
    if ((uVar3 & uVar3 - 1) != 0) {
      return true;
    }
    uVar4 = 0;
    if (uVar3 != 0) {
      for (; (uVar3 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    (this->ifo).checkers = uVar3 - 1 & uVar3;
    PVar1 = (this->pcs).piece_on._M_elems[uVar4];
    if ((PVar1 < king) && ((0x19U >> (PVar1 & 0x1f) & 1) != 0)) {
      local_8 = (this->ifo).stm;
      local_4 = (Square)uVar4;
      SVar2 = (this->ifo).ks[local_8];
      uVar7 = (local_4 & H1) - (SVar2 & H1);
      uVar5 = -uVar7;
      if (0 < (int)uVar7) {
        uVar5 = uVar7;
      }
      uVar8 = ((uint)(uVar4 >> 3) & 0x1fffffff) - ((int)SVar2 >> 3);
      uVar7 = -uVar8;
      if (0 < (int)uVar8) {
        uVar7 = uVar8;
      }
      if ((uVar7 | uVar5) < 2) {
        local_c = local_8 ^ black;
        bVar6 = is_attacked(this,&local_4,&local_8,&local_c,0);
        return bVar6;
      }
    }
  }
  return false;
}

Assistant:

bool position::in_dangerous_check()
{
	if (!in_check())
		return false;

	if (ifo.checkers == 0ULL)
		return false;

	if (bits::more_than_one(ifo.checkers))
		return true;

	auto c = bits::pop_lsb(ifo.checkers);
	auto piece = piece_on(Square(c));
	auto row_dist = util::row_dist(c, (int)king_square());
	auto col_dist = util::col_dist(c, (int)king_square());
	auto us = to_move();
	auto them = to_move() ^ 1;
	auto dangerous_checker = (piece == pawn || piece == rook || piece == queen);

	return dangerous_checker && row_dist <= 1 && col_dist <= 1 && is_attacked(Square(c), Color(us), Color(them));
}